

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

double extract_spR<PredictionData<float,int>,int>
                 (PredictionData<float,_int> *prediction_data,int *row_st,int *row_end,
                 size_t col_num,size_t lb,size_t ub)

{
  int *piVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (col_num <= ub && (lb <= col_num && row_end != row_st)) {
    piVar1 = std::__lower_bound<int_const*,int,__gnu_cxx::__ops::_Iter_less_val>(row_st,row_end);
    if (piVar1 == row_end) {
      dVar2 = 0.0;
    }
    else {
      dVar2 = 0.0;
      if (*piVar1 == (int)col_num) {
        dVar2 = (double)*(float *)((long)prediction_data->Xr +
                                  ((long)piVar1 - (long)prediction_data->Xr_ind));
      }
    }
  }
  return dVar2;
}

Assistant:

static inline double extract_spR(const PredictionData &prediction_data,
                                 const sparse_ix *row_st, const sparse_ix *row_end,
                                 size_t col_num, size_t lb, size_t ub) noexcept
{
    if (row_end == row_st || col_num < lb || col_num > ub)
        return 0.;
    const sparse_ix *search_res = std::lower_bound(row_st, row_end, (sparse_ix) col_num);
    if (search_res == row_end || *search_res != (sparse_ix)col_num)
        return 0.;
    else
        return prediction_data.Xr[search_res - prediction_data.Xr_ind];
}